

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void set_item_name(MIR_item_t_conflict item,char *name)

{
  if (item != (MIR_item_t_conflict)0x0) {
    switch(item->item_type) {
    case MIR_func_item:
    case MIR_proto_item:
    case MIR_data_item:
    case MIR_ref_data_item:
    case MIR_lref_data_item:
    case MIR_expr_data_item:
    case MIR_bss_item:
      ((item->u).func)->name = name;
      break;
    case MIR_import_item:
    case MIR_export_item:
    case MIR_forward_item:
      (item->u).import_id = name;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0xaf1,"void set_item_name(MIR_item_t, const char *)");
    }
    return;
  }
  __assert_fail("item != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0xae5,"void set_item_name(MIR_item_t, const char *)");
}

Assistant:

static void set_item_name (MIR_item_t item, const char *name) {
  mir_assert (item != NULL);
  switch (item->item_type) {
  case MIR_func_item: item->u.func->name = name; break;
  case MIR_proto_item: item->u.proto->name = name; break;
  case MIR_import_item: item->u.import_id = name; break;
  case MIR_export_item: item->u.export_id = name; break;
  case MIR_forward_item: item->u.forward_id = name; break;
  case MIR_bss_item: item->u.bss->name = name; break;
  case MIR_data_item: item->u.data->name = name; break;
  case MIR_ref_data_item: item->u.ref_data->name = name; break;
  case MIR_lref_data_item: item->u.lref_data->name = name; break;
  case MIR_expr_data_item: item->u.expr_data->name = name; break;
  default: mir_assert (FALSE);
  }
}